

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase466::run(TestCase466 *this)

{
  uint *puVar1;
  __pid_t _Var2;
  TransformPromiseNodeBase *pTVar3;
  ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *this_00;
  Refcounted *refcounted;
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> releaseFork;
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> fork;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:480:40),_kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>
  branch2;
  WaitScope waitScope;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:476:40),_kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>
  branch1;
  Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> promise;
  Own<kj::_::PromiseNode> local_70;
  Own<kj::_::PromiseNode> local_60;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  _::yield();
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,(Own<kj::_::PromiseNode> *)&fork,
             _::
             TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:470:51),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041b318;
  releaseFork.hub.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::_::Void,kj::(anonymous_namespace)::TestCase466::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_70.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::_::Void,kj::(anonymous_namespace)::TestCase466::run()::$_0,kj::_::PropagateException>>
        ::instance;
  releaseFork.hub.ptr = (ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)0x0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::_::Void,kj::(anonymous_namespace)::TestCase466::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_70.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)pTVar3;
  Own<kj::_::PromiseNode>::dispose(&local_70);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&releaseFork);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&fork);
  this_00 = (ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)operator_new(0x1d0);
  (this_00->super_ForkHubBase).super_Refcounted.super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_0041b3e0;
  (this_00->super_ForkHubBase).super_Event._vptr_Event = (_func_int **)&DAT_0041b418;
  _::ForkHubBase::ForkHubBase
            ((ForkHubBase *)this_00,(Own<kj::_::PromiseNode> *)&promise,
             &(this_00->result).super_ExceptionOrValue);
  (this_00->super_ForkHubBase).super_Refcounted.super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_0041b3e0;
  (this_00->super_ForkHubBase).super_Event._vptr_Event = (_func_int **)&DAT_0041b418;
  (this_00->result).super_ExceptionOrValue.exception.ptr.isSet = false;
  (this_00->result).value.ptr.disposer = (Disposer *)0x0;
  (this_00->result).value.ptr.ptr = (RefcountedInt *)0x0;
  puVar1 = &(this_00->super_ForkHubBase).super_Refcounted.refcount;
  *puVar1 = *puVar1 + 1;
  releaseFork.hub.ptr = (ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)0x0;
  releaseFork.hub.disposer = (Disposer *)this_00;
  fork.hub.disposer = (Disposer *)this_00;
  fork.hub.ptr = this_00;
  Own<kj::_::ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>_>::~Own(&releaseFork.hub);
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::addBranch
            ((ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)&branch2);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,(Own<kj::_::PromiseNode> *)&branch2,
             _::
             TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:476:40),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041b4d0;
  releaseFork.hub.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::(anonymous_namespace)::TestCase466::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_70.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::(anonymous_namespace)::TestCase466::run()::$_1,kj::_::PropagateException>>
        ::instance;
  releaseFork.hub.ptr = (ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)0x0;
  branch1.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::(anonymous_namespace)::TestCase466::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_70.ptr = (PromiseNode *)0x0;
  branch1.super_PromiseBase.node.ptr = (PromiseNode *)pTVar3;
  Own<kj::_::PromiseNode>::dispose(&local_70);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&releaseFork);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&branch2);
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::addBranch
            ((ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)&local_60);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_60,
             _::
             TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:480:40),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041b558;
  releaseFork.hub.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::(anonymous_namespace)::TestCase466::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_70.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::(anonymous_namespace)::TestCase466::run()::$_2,kj::_::PropagateException>>
        ::instance;
  releaseFork.hub.ptr = (ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)0x0;
  branch2.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::(anonymous_namespace)::TestCase466::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_70.ptr = (PromiseNode *)0x0;
  branch2.super_PromiseBase.node.ptr = (PromiseNode *)pTVar3;
  Own<kj::_::PromiseNode>::dispose(&local_70);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&releaseFork);
  Own<kj::_::PromiseNode>::dispose(&local_60);
  fork.hub.ptr = (ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)0x0;
  releaseFork.hub.disposer = (Disposer *)this_00;
  releaseFork.hub.ptr = this_00;
  Own<kj::_::ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>_>::~Own(&releaseFork.hub);
  _Var2 = Promise<int>::wait(&branch1,&waitScope);
  if ((_Var2 != 0x1c8) && (_::Debug::minSeverity < 3)) {
    releaseFork.hub.disposer = (Disposer *)CONCAT44(releaseFork.hub.disposer._4_4_,0x1c8);
    _Var2 = Promise<int>::wait(&branch1,&waitScope);
    local_70.disposer = (Disposer *)CONCAT44(local_70.disposer._4_4_,_Var2);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1e9,ERROR,
               "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", 456, branch1.wait(waitScope)"
               ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
               (int *)&releaseFork,(int *)&local_70);
  }
  _Var2 = Promise<int>::wait(&branch2,&waitScope);
  if ((_Var2 != 0x315) && (_::Debug::minSeverity < 3)) {
    releaseFork.hub.disposer = (Disposer *)CONCAT44(releaseFork.hub.disposer._4_4_,0x315);
    _Var2 = Promise<int>::wait(&branch2,&waitScope);
    local_70.disposer = (Disposer *)CONCAT44(local_70.disposer._4_4_,_Var2);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1ea,ERROR,
               "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", 789, branch2.wait(waitScope)"
               ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",
               (int *)&releaseFork,(int *)&local_70);
  }
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&branch2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&branch1);
  Own<kj::_::ForkHub<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>_>::~Own(&fork.hub);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, ForkRef) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Own<RefcountedInt>> promise = evalLater([&]() {
    return refcounted<RefcountedInt>(123);
  });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](Own<RefcountedInt>&& i) {
    EXPECT_EQ(123, i->i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](Own<RefcountedInt>&& i) {
    EXPECT_EQ(123, i->i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}